

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzer.cpp
# Opt level: O0

void __thiscall JtagAnalyzer::SetupResults(JtagAnalyzer *this)

{
  byte bVar1;
  JtagAnalyzerResults *this_00;
  element_type *peVar2;
  Channel local_40 [16];
  Channel local_30 [32];
  JtagAnalyzer *local_10;
  JtagAnalyzer *this_local;
  
  local_10 = this;
  this_00 = (JtagAnalyzerResults *)operator_new(0x50);
  JtagAnalyzerResults::JtagAnalyzerResults(this_00,this,&this->mSettings);
  std::auto_ptr<JtagAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<JtagAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar2 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar2);
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&(this->mSettings).mTdiChannel,local_30);
  Channel::~Channel(local_30);
  if ((bVar1 & 1) != 0) {
    peVar2 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar2);
  }
  Channel::Channel(local_40,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  bVar1 = Channel::operator!=(&(this->mSettings).mTdoChannel,local_40);
  Channel::~Channel(local_40);
  if ((bVar1 & 1) != 0) {
    peVar2 = std::auto_ptr<JtagAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar2);
  }
  return;
}

Assistant:

void JtagAnalyzer::SetupResults()
{
    mResults.reset( new JtagAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mTmsChannel );
    if( mSettings.mTdiChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdiChannel );
    if( mSettings.mTdoChannel != UNDEFINED_CHANNEL )
        mResults->AddChannelBubblesWillAppearOn( mSettings.mTdoChannel );
}